

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall helics::apps::Connector::loadTextFile(Connector *this,string *filename)

{
  string_view quoteChars;
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq;
  pointer str_00;
  string_view line;
  stringVector blk;
  int lineNumber;
  vector<int,_std::allocator<int>_> cnts;
  string str;
  AppTextParser aparser;
  
  AppTextParser::AppTextParser(&aparser,filename);
  str._M_dataplus._M_p = (pointer)0x0;
  str._M_string_length = 0;
  str.field_2._M_allocated_capacity = 0;
  AppTextParser::preParseFile(&cnts,&aparser,(vector<char,_std::allocator<char>_> *)&str);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&str);
  AppTextParser::reset(&aparser);
  if (aparser.configStr._M_string_length != 0) {
    App::loadConfigOptions(&this->super_App,&aparser);
    generateParser((Connector *)&blk);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&str,(string *)&aparser.configStr,_S_in);
    CLI::App::parse_from_stream
              ((App *)blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(istream *)&str);
    std::__cxx11::istringstream::~istringstream((istringstream *)&str);
    if (blk.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((blk.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
  }
  CLI::std::__detail::
  _Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>,_std::integral_constant<bool,_true>_>
             *)&this->connections,
            (long)*cnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + (this->connections)._M_h._M_element_count);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    bVar2 = AppTextParser::loadNextLine(&aparser,&str,&lineNumber);
    if (!bVar2) break;
    quoteChars._M_str = (char *)0x38cc69;
    quoteChars._M_len = 3;
    line._M_str = (char *)0x3;
    line._M_len = (size_t)str._M_dataplus._M_p;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_
              (&blk,(stringOps *)str._M_string_length,line,(string_view)ZEXT816(0x38cb33),quoteChars
               ,(delimiter_compression)this);
    pbVar1 = blk.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (str_00 = blk.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; str_00 != pbVar1;
        str_00 = (pointer)((string *)str_00 + 1)) {
      CLI::detail::remove_quotes((string *)str_00);
    }
    addConnectionVector(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&blk);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&blk);
  }
  std::__cxx11::string::~string((string *)&str);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cnts);
  AppTextParser::~AppTextParser(&aparser);
  return;
}

Assistant:

void Connector::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT
    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({});

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    connections.reserve(connections.size() + cnts[0]);
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);
        for (auto& seq : blk) {
            CLI::detail::remove_quotes(seq);
        }
        addConnectionVector(blk);
    }
}